

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall
cli::Parser::
CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~CmdArgument(CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this)

{
  ~CmdArgument(this);
  operator_delete(this);
  return;
}

Assistant:

explicit CmdArgument(const std::string& name, const std::string& alternative, const std::string& description, bool required) : 
				CmdBase(name, alternative, description, required) {
			}